

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::
setCountImpl<axl::sl::SimpleArrayDetails<unsigned_char>::Construct>
          (Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *this,size_t count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  size_t sVar6;
  BufHdr *pBVar7;
  BufHdr *pBVar8;
  ulong in_RSI;
  BufHdr *in_RDI;
  uchar *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  bool result;
  size_t size;
  RefCount **in_stack_ffffffffffffff98;
  BufHdr *in_stack_ffffffffffffffa0;
  Ptr local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  Construct in_stack_ffffffffffffffdf;
  bool local_1;
  
  if (((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) &&
     (sVar6 = rc::RefCount::getRefCount((RefCount *)(in_RDI->super_RefCount).m_freeFunc), sVar6 == 1
     )) {
    uVar1._0_4_ = (in_RDI->super_RefCount).m_refCount;
    uVar1._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
    if (uVar1 == in_RSI) {
      return true;
    }
    if (in_RSI <= *(ulong *)((in_RDI->super_RefCount).m_freeFunc + 0x18)) {
      uVar2._0_4_ = (in_RDI->super_RefCount).m_refCount;
      uVar2._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
      if (uVar2 < in_RSI) {
        SimpleArrayDetails<unsigned_char>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffffdf,
                   (uchar *)((long)(in_RDI->super_RefCount)._vptr_RefCount +
                            *(long *)&(in_RDI->super_RefCount).m_refCount),
                   in_RSI - *(long *)&(in_RDI->super_RefCount).m_refCount);
      }
      else {
        SimpleArrayDetails<unsigned_char>::destruct
                  ((uchar *)((long)(in_RDI->super_RefCount)._vptr_RefCount + in_RSI),
                   *(long *)&(in_RDI->super_RefCount).m_refCount - in_RSI);
      }
      SimpleArrayDetails<unsigned_char>::setHdrCount
                ((Hdr *)(in_RDI->super_RefCount).m_freeFunc,in_RSI);
      (in_RDI->super_RefCount).m_refCount = (int)in_RSI;
      (in_RDI->super_RefCount).m_weakRefCount = (int)(in_RSI >> 0x20);
      return true;
    }
  }
  if (in_RSI == 0) {
    ArrayRef<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_>::release
              ((ArrayRef<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *)in_RDI);
    local_1 = true;
  }
  else {
    lVar4._0_4_ = (in_RDI->super_RefCount).m_refCount;
    lVar4._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
    if (lVar4 == 0) {
      bVar5 = reserve((Array<unsigned_char,_axl::sl::ArrayDetails<unsigned_char>_> *)
                      CONCAT17(in_stack_ffffffffffffffdf,
                               CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)),
                      in_stack_ffffffffffffffd0);
      if (bVar5) {
        SimpleArrayDetails<unsigned_char>::Construct::operator()
                  ((Construct *)&stack0xffffffffffffffdd,
                   (uchar *)(in_RDI->super_RefCount)._vptr_RefCount,in_RSI);
        SimpleArrayDetails<unsigned_char>::setHdrCount
                  ((Hdr *)(in_RDI->super_RefCount).m_freeFunc,in_RSI);
        (in_RDI->super_RefCount).m_refCount = (int)in_RSI;
        (in_RDI->super_RefCount).m_weakRefCount = (int)(in_RSI >> 0x20);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      getAllocSize(0x18666a);
      pBVar7 = (BufHdr *)mem::allocate(0x18667d);
      rc::BufHdr::BufHdr(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98,
                         (uintptr_t)in_RDI);
      rc::primeRefCount<axl::rc::BufHdr>(in_RDI,(FreeFunc *)pBVar7);
      rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>((Ptr<axl::rc::BufHdr> *)in_RDI,pBVar7);
      pBVar8 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
      if (pBVar8 == (BufHdr *)0x0) {
        local_1 = false;
      }
      else {
        pBVar8 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
        SimpleArrayDetails<unsigned_char>::setHdrCount(pBVar8,in_RSI);
        pBVar8 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
        pBVar8 = pBVar8 + 1;
        uVar3._0_4_ = (in_RDI->super_RefCount).m_refCount;
        uVar3._4_4_ = (in_RDI->super_RefCount).m_weakRefCount;
        if (uVar3 < in_RSI) {
          SimpleArrayDetails<unsigned_char>::constructCopy((uchar *)in_RDI,(uchar *)pBVar7,0x18675b)
          ;
          lVar4 = *(long *)&(in_RDI->super_RefCount).m_refCount;
          SimpleArrayDetails<unsigned_char>::Construct::operator()
                    ((Construct *)&stack0xffffffffffffff9f,
                     (uchar *)((long)&(pBVar8->super_RefCount)._vptr_RefCount + lVar4),
                     in_RSI - lVar4);
        }
        else {
          SimpleArrayDetails<unsigned_char>::constructCopy((uchar *)in_RDI,(uchar *)pBVar7,0x186724)
          ;
        }
        rc::RefCount::release(&in_RDI->super_RefCount);
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)pBVar8;
        pBVar7 = rc::Ptr<axl::rc::BufHdr>::detach
                           ((Ptr<axl::rc::BufHdr> *)pBVar8,in_stack_ffffffffffffff98);
        (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar7;
        (in_RDI->super_RefCount).m_refCount = (int)in_RSI;
        (in_RDI->super_RefCount).m_weakRefCount = (int)(in_RSI >> 0x20);
        local_1 = true;
      }
      rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x1867db);
    }
  }
  return local_1;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}